

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void set_config_voice_cold_1(void)

{
  fprintf(_stderr,"%s\n",anon_var_dwarf_4e0);
  return;
}

Assistant:

void console_message(const char *mes)
{
#if defined(_WIN32)
	char *temp = u8tosjis(mes);
	if (temp == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return;
	}
	fprintf(stderr, temp);
	free(temp);
#else
	fprintf(stderr, "%s\n", mes);
#endif
}